

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix.c
# Opt level: O0

int Test_SUNMatScaleAdd(SUNMatrix A,SUNMatrix I,int myid)

{
  uint uVar1;
  int iVar2;
  SUNMatrix A_00;
  undefined8 uVar3;
  undefined8 uVar4;
  uint in_EDX;
  undefined8 in_RSI;
  SUNMatrix in_RDI;
  SUNMatrix A_01;
  double dVar5;
  double dVar6;
  sunrealtype tol;
  SUNMatrix D;
  SUNMatrix C;
  SUNMatrix B;
  double stop_time;
  double start_time;
  int failure;
  SUNMatrix in_stack_ffffffffffffffa8;
  int local_4;
  
  A_00 = (SUNMatrix)SUNMatClone(in_RDI);
  uVar1 = SUNMatCopy(in_RDI,A_00);
  if (uVar1 == 0) {
    A_01 = (SUNMatrix)get_time();
    uVar1 = SUNMatScaleAdd(0xbff0000000000000,A_00,A_00);
    sync_device(A_00);
    dVar5 = get_time();
    if (uVar1 == 0) {
      iVar2 = check_matrix_entry(A_01,dVar5,(sunrealtype)A_00);
      if (iVar2 == 0) {
        if ((print_all_ranks == 0) && (in_EDX == 0)) {
          printf("    PASSED test -- SUNMatScaleAdd case 1 \n");
        }
        else if (print_all_ranks != 0) {
          printf("process %06d: ",(ulong)in_EDX);
          printf("    PASSED test -- SUNMatScaleAdd case 1 \n");
        }
        if ((in_EDX == 0) && (print_time != 0)) {
          printf("    SUNMatScaleAdd Time: %22.15e \n \n",dVar5 - (double)A_01);
        }
        iVar2 = is_square(in_stack_ffffffffffffffa8);
        if (((iVar2 != 0) && (iVar2 = SUNMatGetID(in_RDI), iVar2 != 6)) &&
           (iVar2 = SUNMatGetID(in_RDI), iVar2 != 1)) {
          uVar3 = SUNMatClone(in_RDI);
          uVar1 = SUNMatCopy(in_RDI,uVar3);
          if (uVar1 != 0) {
            if ((print_all_ranks == 0) && (in_EDX == 0)) {
              printf(">>> FAILED test -- SUNMatCopy returned %d \n",(ulong)uVar1);
            }
            else if (print_all_ranks != 0) {
              printf("process %06d: ",(ulong)in_EDX);
              printf(">>> FAILED test -- SUNMatCopy returned %d \n",(ulong)uVar1);
            }
            SUNMatDestroy(A_00);
            SUNMatDestroy(uVar3);
            return 1;
          }
          uVar4 = SUNMatClone(in_RSI);
          uVar1 = SUNMatCopy(in_RSI,uVar4);
          if (uVar1 != 0) {
            if ((print_all_ranks == 0) && (in_EDX == 0)) {
              printf(">>> FAILED test -- SUNMatCopy returned %d \n",(ulong)uVar1);
            }
            else if (print_all_ranks != 0) {
              printf("process %06d: ",(ulong)in_EDX);
              printf(">>> FAILED test -- SUNMatCopy returned %d \n",(ulong)uVar1);
            }
            SUNMatDestroy(A_00);
            SUNMatDestroy(uVar4);
            SUNMatDestroy(uVar3);
            return 1;
          }
          dVar5 = get_time();
          uVar1 = SUNMatScaleAdd(0x3ff0000000000000,uVar3,in_RSI);
          if (uVar1 != 0) {
            if ((print_all_ranks == 0) && (in_EDX == 0)) {
              printf(">>> FAILED test -- SUNMatScaleAdd returned %d \n",(ulong)uVar1);
            }
            else if (print_all_ranks != 0) {
              printf("process %06d: ",(ulong)in_EDX);
              printf(">>> FAILED test -- SUNMatScaleAdd returned %d \n",(ulong)uVar1);
            }
            SUNMatDestroy(A_00);
            SUNMatDestroy(uVar4);
            SUNMatDestroy(uVar3);
            return 1;
          }
          uVar1 = SUNMatScaleAdd(0x3ff0000000000000,uVar4,in_RDI);
          if (uVar1 != 0) {
            if ((print_all_ranks == 0) && (in_EDX == 0)) {
              printf(">>> FAILED test -- SUNMatScaleAdd returned %d \n",(ulong)uVar1);
            }
            else if (print_all_ranks != 0) {
              printf("process %06d: ",(ulong)in_EDX);
              printf(">>> FAILED test -- SUNMatScaleAdd returned %d \n",(ulong)uVar1);
            }
            SUNMatDestroy(A_00);
            SUNMatDestroy(uVar4);
            SUNMatDestroy(uVar3);
            return 1;
          }
          sync_device(in_RDI);
          dVar6 = get_time();
          iVar2 = check_matrix(A,I,(sunrealtype)CONCAT44(myid,failure));
          if (iVar2 != 0) {
            if ((print_all_ranks == 0) && (in_EDX == 0)) {
              printf(">>> FAILED test -- SUNMatScaleAdd case 2 \n");
            }
            else if (print_all_ranks != 0) {
              printf("process %06d: ",(ulong)in_EDX);
              printf(">>> FAILED test -- SUNMatScaleAdd case 2 \n");
            }
            if (print_time != 0) {
              printf("    SUNMatScaleAdd Time: %22.15e \n \n",dVar6 - dVar5);
            }
            SUNMatDestroy(A_00);
            SUNMatDestroy(uVar4);
            SUNMatDestroy(uVar3);
            return 1;
          }
          if ((print_all_ranks == 0) && (in_EDX == 0)) {
            printf("    PASSED test -- SUNMatScaleAdd case 2 \n");
          }
          else if (print_all_ranks != 0) {
            printf("process %06d: ",(ulong)in_EDX);
            printf("    PASSED test -- SUNMatScaleAdd case 2 \n");
          }
          if ((in_EDX == 0) && (print_time != 0)) {
            printf("    SUNMatScaleAdd Time: %22.15e \n \n",dVar6 - dVar5);
          }
          SUNMatDestroy(uVar4);
          SUNMatDestroy(uVar3);
        }
        SUNMatDestroy(A_00);
        local_4 = 0;
      }
      else {
        if ((print_all_ranks == 0) && (in_EDX == 0)) {
          printf(">>> FAILED test -- SUNMatScaleAdd case 1 check  \n");
        }
        else if (print_all_ranks != 0) {
          printf("process %06d: ",(ulong)in_EDX);
          printf(">>> FAILED test -- SUNMatScaleAdd case 1 check  \n");
        }
        if (print_time != 0) {
          printf("    SUNMatScaleAdd Time: %22.15e \n \n",dVar5 - (double)A_01);
        }
        SUNMatDestroy(A_00);
        local_4 = 1;
      }
    }
    else {
      if ((print_all_ranks == 0) && (in_EDX == 0)) {
        printf(">>> FAILED test -- SUNMatScaleAdd returned %d \n",(ulong)uVar1);
      }
      else if (print_all_ranks != 0) {
        printf("process %06d: ",(ulong)in_EDX);
        printf(">>> FAILED test -- SUNMatScaleAdd returned %d \n",(ulong)uVar1);
      }
      SUNMatDestroy(A_00);
      local_4 = 1;
    }
  }
  else {
    if ((print_all_ranks == 0) && (in_EDX == 0)) {
      printf(">>> FAILED test -- SUNMatCopy returned %d \n",(ulong)uVar1);
    }
    else if (print_all_ranks != 0) {
      printf("process %06d: ",(ulong)in_EDX);
      printf(">>> FAILED test -- SUNMatCopy returned %d \n",(ulong)uVar1);
    }
    SUNMatDestroy(A_00);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int Test_SUNMatScaleAdd(SUNMatrix A, SUNMatrix I, int myid)
{
  int failure;
  double start_time, stop_time;
  SUNMatrix B, C, D;
  sunrealtype tol = 10 * SUN_UNIT_ROUNDOFF;

  /*
   * Case 1: same sparsity/bandwith pattern
   */

  /* protect A */
  B       = SUNMatClone(A);
  failure = SUNMatCopy(A, B);
  if (failure)
  {
    TEST_STATUS2(">>> FAILED test -- SUNMatCopy returned %d \n", failure, myid);
    SUNMatDestroy(B);
    return (1);
  }

  /* fill vector data */
  start_time = get_time();
  failure    = SUNMatScaleAdd(NEG_ONE, B, B);
  sync_device(B);
  stop_time = get_time();

  if (failure)
  {
    TEST_STATUS2(">>> FAILED test -- SUNMatScaleAdd returned %d \n", failure,
                 myid);
    SUNMatDestroy(B);
    return (1);
  }

  /* check matrix entries */
  failure = check_matrix_entry(B, ZERO, tol);

  if (failure)
  {
    TEST_STATUS(">>> FAILED test -- SUNMatScaleAdd case 1 check  \n", myid);
    PRINT_TIME("    SUNMatScaleAdd Time: %22.15e \n \n", stop_time - start_time);
    SUNMatDestroy(B);
    return (1);
  }
  else { TEST_STATUS("    PASSED test -- SUNMatScaleAdd case 1 \n", myid); }

  if (myid == 0)
  {
    PRINT_TIME("    SUNMatScaleAdd Time: %22.15e \n \n", stop_time - start_time);
  }

  /*
   * Case 2: different sparsity/bandwidth patterns
   */
  if (is_square(A) && SUNMatGetID(A) != SUNMATRIX_CUSPARSE &&
      SUNMatGetID(A) != SUNMATRIX_MAGMADENSE)
  {
    /* protect A and I */
    D       = SUNMatClone(A);
    failure = SUNMatCopy(A, D);
    if (failure)
    {
      TEST_STATUS2(">>> FAILED test -- SUNMatCopy returned %d \n", failure, myid);
      SUNMatDestroy(B);
      SUNMatDestroy(D);
      return (1);
    }
    C       = SUNMatClone(I);
    failure = SUNMatCopy(I, C);
    if (failure)
    {
      TEST_STATUS2(">>> FAILED test -- SUNMatCopy returned %d \n", failure, myid);
      SUNMatDestroy(B);
      SUNMatDestroy(C);
      SUNMatDestroy(D);
      return (1);
    }

    /* fill B and C */
    start_time = get_time();
    failure    = SUNMatScaleAdd(ONE, D, I);
    if (failure)
    {
      TEST_STATUS2(">>> FAILED test -- SUNMatScaleAdd returned %d \n", failure,
                   myid);
      SUNMatDestroy(B);
      SUNMatDestroy(C);
      SUNMatDestroy(D);
      return (1);
    }
    failure = SUNMatScaleAdd(ONE, C, A);
    if (failure)
    {
      TEST_STATUS2(">>> FAILED test -- SUNMatScaleAdd returned %d \n", failure,
                   myid);
      SUNMatDestroy(B);
      SUNMatDestroy(C);
      SUNMatDestroy(D);
      return (1);
    }
    sync_device(A);
    stop_time = get_time();

    failure = check_matrix(D, C, tol);
    if (failure)
    {
      TEST_STATUS(">>> FAILED test -- SUNMatScaleAdd case 2 \n", myid);
      PRINT_TIME("    SUNMatScaleAdd Time: %22.15e \n \n",
                 stop_time - start_time);
      SUNMatDestroy(B);
      SUNMatDestroy(C);
      SUNMatDestroy(D);
      return (1);
    }
    else { TEST_STATUS("    PASSED test -- SUNMatScaleAdd case 2 \n", myid); }

    if (myid == 0)
    {
      PRINT_TIME("    SUNMatScaleAdd Time: %22.15e \n \n",
                 stop_time - start_time);
    }

    SUNMatDestroy(C);
    SUNMatDestroy(D);
  }

  SUNMatDestroy(B);

  return (0);
}